

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveEntityReliablePdu.cpp
# Opt level: O0

int __thiscall DIS::RemoveEntityReliablePdu::getMarshalledSize(RemoveEntityReliablePdu *this)

{
  int iVar1;
  int marshalSize;
  RemoveEntityReliablePdu *this_local;
  
  iVar1 = SimulationManagementWithReliabilityFamilyPdu::getMarshalledSize
                    (&this->super_SimulationManagementWithReliabilityFamilyPdu);
  return iVar1 + 8;
}

Assistant:

int RemoveEntityReliablePdu::getMarshalledSize() const
{
   int marshalSize = 0;

   marshalSize = SimulationManagementWithReliabilityFamilyPdu::getMarshalledSize();
   marshalSize = marshalSize + 1;  // _requiredReliabilityService
   marshalSize = marshalSize + 2;  // _pad1
   marshalSize = marshalSize + 1;  // _pad2
   marshalSize = marshalSize + 4;  // _requestID
    return marshalSize;
}